

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::CleanUpForInCache(FunctionBody *this,bool isShutdown)

{
  ProfileId PVar1;
  EnumeratorCache *obj;
  
  PVar1 = GetProfiledForInLoopCount(this);
  if (PVar1 != 0) {
    obj = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)22,Js::EnumeratorCache*>
                    ((FunctionProxy *)this);
    if (obj != (EnumeratorCache *)0x0) {
      if (isShutdown) {
        memset(obj,0,(ulong)PVar1 << 4);
        return;
      }
      Memory::DeleteArray<Memory::CacheAllocator,Js::EnumeratorCache>
                (&((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                  enumeratorCacheAllocator,(ulong)PVar1,obj);
      FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)22,decltype(nullptr)>
                ((FunctionProxy *)this,(void *)0x0);
      return;
    }
  }
  return;
}

Assistant:

void FunctionBody::CleanUpForInCache(bool isShutdown)
    {
        uint profiledForInLoopCount = this->GetProfiledForInLoopCount();
        if (profiledForInLoopCount == 0)
        {
            return;
        }
        EnumeratorCache * forInCacheArray = this->GetAuxPtr<AuxPointerType::ForInCacheArray>();
        if (forInCacheArray)
        {
            if (isShutdown)
            {
                memset(forInCacheArray, 0, sizeof(EnumeratorCache) * profiledForInLoopCount);
            }
            else
            {
                AllocatorDeleteArray(CacheAllocator, this->GetScriptContext()->GetEnumeratorAllocator(), profiledForInLoopCount, forInCacheArray);
                this->SetAuxPtr<AuxPointerType::ForInCacheArray>(nullptr);
            }
        }
    }